

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

uint __thiscall llvm::SourceMgr::SrcBuffer::getLineNumber<unsigned_long>(SrcBuffer *this,char *Ptr)

{
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var1;
  char *pcVar2;
  iterator __position;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  unsigned_long in_RAX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  unsigned_long local_38;
  
  uVar6 = (this->OffsetCache).Val.Val.Value;
  local_38 = in_RAX;
  if (uVar6 < 8) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new(0x18);
    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((ulong)this_00 & 7) != 0) {
      __assert_fail("(PtrWord & ~PointerBitMask) == 0 && \"Pointer is not sufficiently aligned\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/PointerIntPair.h"
                    ,0xa3,
                    "static intptr_t llvm::PointerIntPairInfo<void *, 1, llvm::PointerUnionUIntTraits<std::vector<unsigned int> *, std::vector<unsigned long> *>>::updatePointer(intptr_t, PointerT) [PointerT = void *, IntBits = 1, PtrTraits = llvm::PointerUnionUIntTraits<std::vector<unsigned int> *, std::vector<unsigned long> *>]"
                   );
    }
    (this->OffsetCache).Val.Val.Value = (ulong)this_00 | 6;
    _Var1._M_head_impl =
         (this->Buffer)._M_t.
         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
         super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    pcVar2 = (_Var1._M_head_impl)->BufferStart;
    lVar7 = (long)(_Var1._M_head_impl)->BufferEnd - (long)pcVar2;
    if (lVar7 != 0) {
      uVar10 = 0;
      do {
        if (pcVar2[uVar10] == '\n') {
          __position._M_current =
               (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_38 = uVar10;
          if (__position._M_current ==
              (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(this_00,__position,&local_38);
          }
          else {
            *__position._M_current = uVar10;
            (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        uVar10 = uVar10 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != uVar10);
    }
  }
  else {
    if ((~(uint)uVar6 & 6) != 0) {
      __assert_fail("is<T>() && \"Invalid accessor called\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/PointerUnion.h"
                    ,0x189,
                    "T llvm::PointerUnion4<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>::get() const [PT1 = std::vector<unsigned char> *, PT2 = std::vector<unsigned short> *, PT3 = std::vector<unsigned int> *, PT4 = std::vector<unsigned long> *, T = std::vector<unsigned long> *]"
                   );
    }
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(uVar6 & 0xfffffffffffffff8);
  }
  _Var1._M_head_impl =
       (this->Buffer)._M_t.
       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
       super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
  pcVar2 = (_Var1._M_head_impl)->BufferStart;
  if ((pcVar2 <= Ptr) && (Ptr <= (_Var1._M_head_impl)->BufferEnd)) {
    uVar6 = (long)Ptr - (long)pcVar2;
    if (-1 < (long)uVar6) {
      puVar3 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = puVar3;
      uVar9 = (long)(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
      while (puVar4 = puVar5, 0 < (long)uVar9) {
        uVar8 = uVar9 >> 1;
        uVar9 = ~uVar8 + uVar9;
        puVar5 = puVar4 + uVar8 + 1;
        if (uVar6 <= puVar4[uVar8]) {
          puVar5 = puVar4;
          uVar9 = uVar8;
        }
      }
      return (int)((ulong)((long)puVar4 - (long)puVar3) >> 3) + 1;
    }
    __assert_fail("PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                  ,0x5f,
                  "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned long]"
                 );
  }
  __assert_fail("Ptr >= BufStart && Ptr <= Buffer->getBufferEnd()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                ,0x5d,
                "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned long]"
               );
}

Assistant:

unsigned SourceMgr::SrcBuffer::getLineNumber(const char *Ptr) const {

  // Ensure OffsetCache is allocated and populated with offsets of all the
  // '\n' bytes.
  std::vector<T> *Offsets = nullptr;
  if (OffsetCache.isNull()) {
    Offsets = new std::vector<T>();
    OffsetCache = Offsets;
    size_t Sz = Buffer->getBufferSize();
    assert(Sz <= std::numeric_limits<T>::max());
    StringRef S = Buffer->getBuffer();
    for (size_t N = 0; N < Sz; ++N) {
      if (S[N] == '\n') {
        Offsets->push_back(static_cast<T>(N));
      }
    }
  } else {
    Offsets = OffsetCache.get<std::vector<T> *>();
  }

  const char *BufStart = Buffer->getBufferStart();
  assert(Ptr >= BufStart && Ptr <= Buffer->getBufferEnd());
  ptrdiff_t PtrDiff = Ptr - BufStart;
  assert(PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max());
  T PtrOffset = static_cast<T>(PtrDiff);

  // std::lower_bound returns the first EOL offset that's not-less-than
  // PtrOffset, meaning the EOL that _ends the line_ that PtrOffset is on
  // (including if PtrOffset refers to the EOL itself). If there's no such
  // EOL, returns end().
  auto EOL = std::lower_bound(Offsets->begin(), Offsets->end(), PtrOffset);

  // Lines count from 1, so add 1 to the distance from the 0th line.
  return (1 + (EOL - Offsets->begin()));
}